

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  long lVar2;
  size_t sVar3;
  OneofDescriptor *oneof_descriptor;
  bool bVar4;
  size_type __n;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CppType CVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar9;
  undefined4 extraout_var_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Descriptor *pDVar11;
  long *plVar12;
  undefined4 extraout_var_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Descriptor *pDVar14;
  ReservedRange *pRVar15;
  undefined8 *puVar16;
  LogMessage *other;
  FieldDescriptor *pFVar17;
  MessageFactory *factory;
  MessageLite *this_00;
  size_type *psVar18;
  Reflection *extraout_RDX;
  char *pcVar19;
  code *pcVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  ulong uVar23;
  string full_type_name;
  string prefix;
  string serialized_value;
  string field_name;
  int32 field_number;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [2];
  string local_198;
  Message *local_178;
  string local_170;
  Reflection *local_150;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ParserImpl *local_e8;
  Descriptor *local_e0;
  FieldDescriptor *local_d8;
  FieldDescriptor *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  ulong local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_04;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_150 = extraout_RDX;
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  pDVar11 = (Descriptor *)CONCAT44(extraout_var,iVar7);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_c0 = (ulong)(uint)(this->tokenizer_).current_.line;
  local_b8 = (ulong)(uint)(this->tokenizer_).current_.column;
  local_178 = message;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_d0,&local_d8);
  if (bVar5) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
    bVar5 = TryConsume(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    bVar5 = false;
  }
  if (bVar5 != false) {
    local_1d0._8_8_ = (char *)0x0;
    local_1c0[0]._M_allocated_capacity = local_1c0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_string_length = 0;
    local_198.field_2._M_allocated_capacity =
         local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1d0._0_8_ = local_1d0 + 0x10;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    bVar5 = ConsumeAnyTypeUrl(this,(string *)local_1d0,&local_198);
    if (bVar5) {
      paVar13 = &local_170.field_2;
      local_170._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"]","");
      bVar5 = Consume(this,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar13) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (bVar5) {
        local_170._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,":","");
        TryConsume(this,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != paVar13) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        local_170._M_string_length = 0;
        local_170.field_2._M_allocated_capacity =
             local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          local_170._M_dataplus._M_p = (pointer)paVar13;
          pDVar11 = anon_unknown_19::DefaultFinderFindAnyType
                              (local_178,&local_198,(string *)local_1d0);
        }
        else {
          local_170._M_dataplus._M_p = (pointer)paVar13;
          iVar7 = (*pFVar1->_vptr_Finder[4])(pFVar1,local_178,&local_198,local_1d0);
          pDVar11 = (Descriptor *)CONCAT44(extraout_var_00,iVar7);
        }
        if (pDVar11 == (Descriptor *)0x0) {
          std::operator+(&local_b0,"Could not find type \"",&local_198);
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,local_1d0._0_8_);
          psVar18 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_108.field_2._M_allocated_capacity = *psVar18;
            local_108.field_2._8_8_ = plVar12[3];
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar18;
            local_108._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_108._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_108);
          psVar18 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_148.field_2._M_allocated_capacity = *psVar18;
            local_148.field_2._8_8_ = plVar12[3];
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar18;
            local_148._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_148._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_002ac040:
            operator_delete(local_b0._M_dataplus._M_p);
          }
LAB_002ac045:
          bVar5 = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,pDVar11,&local_170);
          if (!bVar5) goto LAB_002ac045;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(local_d0 + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(local_150,local_178,local_d0), bVar5)) ||
              ((*(int *)(local_d8 + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(local_150,local_178,local_d8), bVar5)))))) {
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Non-repeated Any specified multiple times.","");
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        &local_148);
            local_b0._M_dataplus._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_002ac040;
            goto LAB_002ac045;
          }
          std::operator+(&local_50,&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0);
          Reflection::SetString(local_150,local_178,local_d0,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_170._M_dataplus._M_p,
                     (FieldDescriptor *)(local_170._M_dataplus._M_p + local_170._M_string_length));
          Reflection::SetString(local_150,local_178,local_d8,&local_90);
          bVar5 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != paVar13) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      else {
        bVar5 = false;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_);
    }
    goto LAB_002ad053;
  }
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"[","");
  bVar5 = TryConsume(this,(string *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,&local_128);
    if (bVar5) {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"]","");
      bVar5 = Consume(this,(string *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_);
      }
      if (bVar5) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar7 = (*(local_178->super_MessageLite)._vptr_MessageLite[0x15])();
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)DescriptorPool::FindExtensionByPrintableName
                                 (*(DescriptorPool **)
                                   (*(long *)((Descriptor *)CONCAT44(extraout_var_03,iVar7) + 0x10)
                                   + 0x10),(Descriptor *)CONCAT44(extraout_var_03,iVar7),&local_128)
          ;
        }
        else {
          iVar7 = (*pFVar1->_vptr_Finder[2])(pFVar1,local_178,&local_128);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(extraout_var_01,iVar7);
        }
        if (paVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
            std::operator+(&local_148,"Ignoring extension \"",&local_128);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_148);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar13) {
              local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_170.field_2._8_8_ = plVar12[3];
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            }
            else {
              local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_170._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_170._M_string_length = plVar12[1];
            *plVar12 = (long)paVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::operator+(&local_198,&local_170,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (pDVar11 + 8));
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_198);
            local_1d0._0_8_ = local_1d0 + 0x10;
            pcVar20 = (code *)(plVar12 + 2);
            if ((code *)*plVar12 == pcVar20) {
              local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
              local_1c0[0]._8_8_ = plVar12[3];
            }
            else {
              local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
              local_1d0._0_8_ = (code *)*plVar12;
            }
            local_1d0._8_8_ = plVar12[1];
            *plVar12 = (long)pcVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          (string *)local_1d0);
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            goto LAB_002ac35a;
          }
          std::operator+(&local_148,"Extension \"",&local_128);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 == paVar13) {
            local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_170.field_2._8_8_ = puVar16[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_170._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_170._M_string_length = puVar16[1];
          *puVar16 = paVar13;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          std::operator+(&local_198,&local_170,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (pDVar11 + 8));
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
          local_1d0._0_8_ = local_1d0 + 0x10;
          pcVar20 = (code *)(puVar16 + 2);
          if ((code *)*puVar16 == pcVar20) {
            local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
            local_1c0[0]._8_8_ = puVar16[3];
          }
          else {
            local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
            local_1d0._0_8_ = (code *)*puVar16;
          }
          local_1d0._8_8_ = puVar16[1];
          *puVar16 = pcVar20;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_1d0);
          goto LAB_002aca42;
        }
LAB_002ac35a:
        bVar5 = false;
        goto LAB_002ac60a;
      }
    }
    goto LAB_002ad051;
  }
  bVar5 = ConsumeIdentifier(this,&local_128);
  if (!bVar5) goto LAB_002ad051;
  local_e0 = pDVar11;
  if ((this->allow_field_number_ == true) &&
     (bVar5 = safe_strto32(&local_128,(int32 *)&local_108), bVar5)) {
    pEVar9 = Descriptor::FindExtensionRangeContainingNumber(pDVar11,(int)local_108._M_dataplus._M_p)
    ;
    if (pEVar9 == (ExtensionRange *)0x0) {
      pRVar15 = Descriptor::FindReservedRangeContainingNumber
                          (pDVar11,(int)local_108._M_dataplus._M_p);
      if (pRVar15 != (ReservedRange *)0x0) {
        bVar5 = true;
        goto LAB_002ac254;
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)Descriptor::FindFieldByNumber(pDVar11,(int)local_108._M_dataplus._M_p);
    }
    else {
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)DescriptorPool::FindExtensionByNumber
                               (*(DescriptorPool **)(*(long *)(pDVar11 + 0x10) + 0x10),pDVar11,
                                (int)local_108._M_dataplus._M_p);
      }
      else {
        iVar7 = (*pFVar1->_vptr_Finder[3])(pFVar1,pDVar11);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(extraout_var_02,iVar7);
      }
    }
LAB_002ac3d1:
    bVar5 = false;
  }
  else {
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)Descriptor::FindFieldByName(pDVar11,&local_128);
    if (paVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      if ((char *)local_1d0._8_8_ != (char *)0x0) {
        pcVar19 = (char *)0x0;
        do {
          if ((byte)((char)*(code *)(local_1d0._0_8_ + (long)pcVar19) + 0xbfU) < 0x1a) {
            *(byte *)(local_1d0._0_8_ + (long)pcVar19) =
                 (byte)*(code *)(local_1d0._0_8_ + (long)pcVar19) | 0x20;
          }
          pcVar19 = pcVar19 + 1;
        } while ((char *)local_1d0._8_8_ != pcVar19);
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)Descriptor::FindFieldByName(pDVar11,(string *)local_1d0);
      if (paVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      else {
        if (*(once_flag **)(paVar10->_M_local_buf + 0x30) != (once_flag *)0x0) {
          local_198._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_170._M_dataplus._M_p = (pointer)paVar10;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar10->_M_local_buf + 0x30),
                     (_func_void_FieldDescriptor_ptr **)&local_198,(FieldDescriptor **)&local_170);
        }
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        if (*(int *)(paVar10->_M_local_buf + 0x38) == 10) {
          paVar13 = paVar10;
        }
      }
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_);
      }
    }
    if (paVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_002ac105:
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    }
    else {
      if (*(once_flag **)(paVar13->_M_local_buf + 0x30) != (once_flag *)0x0) {
        local_1d0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_198._M_dataplus._M_p = (pointer)paVar13;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(paVar13->_M_local_buf + 0x30),
                   (_func_void_FieldDescriptor_ptr **)local_1d0,(FieldDescriptor **)&local_198);
      }
      if (*(int *)(paVar13->_M_local_buf + 0x38) == 10) {
        pDVar14 = FieldDescriptor::message_type((FieldDescriptor *)paVar13->_M_local_buf);
        sVar3 = (*(undefined8 **)pDVar14)[1];
        if (sVar3 != local_128._M_string_length) goto LAB_002ac105;
        if (sVar3 != 0) {
          iVar7 = bcmp((void *)**(undefined8 **)pDVar14,local_128._M_dataplus._M_p,sVar3);
          if (iVar7 != 0) {
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          }
        }
      }
    }
    if (paVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (this->allow_case_insensitive_field_ == true) {
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d0,local_128._M_dataplus._M_p,
                   local_128._M_dataplus._M_p + local_128._M_string_length);
        if ((char *)local_1d0._8_8_ != (char *)0x0) {
          pcVar19 = (char *)0x0;
          do {
            if ((byte)((char)*(code *)(local_1d0._0_8_ + (long)pcVar19) + 0xbfU) < 0x1a) {
              *(byte *)(local_1d0._0_8_ + (long)pcVar19) =
                   (byte)*(code *)(local_1d0._0_8_ + (long)pcVar19) | 0x20;
            }
            pcVar19 = pcVar19 + 1;
          } while ((char *)local_1d0._8_8_ != pcVar19);
        }
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)Descriptor::FindFieldByLowercaseName(pDVar11,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
      }
      else {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
    }
    __n = local_128._M_string_length;
    if (paVar13 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_002ac3d1;
    uVar22 = (ulong)*(int *)(pDVar11 + 0x84);
    bVar5 = 0 < (long)uVar22;
    if (0 < (long)uVar22) {
      lVar2 = *(long *)(pDVar11 + 0x60);
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_128._M_dataplus._M_p;
      bVar5 = true;
      uVar23 = 1;
      local_e8 = this;
      do {
        puVar16 = *(undefined8 **)(lVar2 + -8 + uVar23 * 8);
        if ((__n == puVar16[1]) &&
           ((this = local_e8, __n == 0 ||
            (iVar7 = bcmp(local_c8,(void *)*puVar16,__n), this = local_e8, iVar7 == 0)))) break;
        bVar5 = uVar23 < uVar22;
        bVar6 = uVar23 != uVar22;
        this = local_e8;
        uVar23 = uVar23 + 1;
      } while (bVar6);
    }
LAB_002ac254:
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  if (paVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0 && !bVar5) {
    if (this->allow_unknown_field_ != false) {
      std::operator+(&local_148,"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (local_e0 + 8));
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar10) {
        local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_170.field_2._8_8_ = puVar16[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_170._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_170._M_string_length = puVar16[1];
      *puVar16 = paVar10;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      std::operator+(&local_198,&local_170,&local_128);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
      local_1d0._0_8_ = local_1d0 + 0x10;
      pcVar20 = (code *)(puVar16 + 2);
      if ((code *)*puVar16 == pcVar20) {
        local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
        local_1c0[0]._8_8_ = puVar16[3];
      }
      else {
        local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
        local_1d0._0_8_ = (code *)*puVar16;
      }
      local_1d0._8_8_ = puVar16[1];
      *puVar16 = pcVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      goto LAB_002ac60a;
    }
    std::operator+(&local_148,"Message type \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (local_e0 + 8));
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar13) {
      local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_170.field_2._8_8_ = puVar16[3];
    }
    else {
      local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_170._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_170._M_string_length = puVar16[1];
    *puVar16 = paVar13;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    std::operator+(&local_198,&local_170,&local_128);
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
    local_1d0._0_8_ = local_1d0 + 0x10;
    pcVar20 = (code *)(puVar16 + 2);
    if ((code *)*puVar16 == pcVar20) {
      local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
      local_1c0[0]._8_8_ = puVar16[3];
    }
    else {
      local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
      local_1d0._0_8_ = (code *)*puVar16;
    }
    local_1d0._8_8_ = puVar16[1];
    *puVar16 = pcVar20;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                (string *)local_1d0);
LAB_002aca42:
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    paVar13 = &local_148.field_2;
    goto LAB_002acc4c;
  }
LAB_002ac60a:
  if (paVar13 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      if ((*(int *)(paVar13->_M_local_buf + 0x3c) == 3) ||
         (bVar5 = Reflection::HasField(local_150,local_178,(FieldDescriptor *)paVar13->_M_local_buf)
         , !bVar5)) {
        oneof_descriptor = *(OneofDescriptor **)(paVar13->_M_local_buf + 0x58);
        if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
           (bVar5 = Reflection::HasOneof(local_150,local_178,oneof_descriptor), !bVar5))
        goto LAB_002ac8c4;
        pFVar17 = Reflection::GetOneofFieldDescriptor(local_150,local_178,oneof_descriptor);
        std::operator+(&local_b0,"Field \"",&local_128);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        psVar18 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_108.field_2._M_allocated_capacity = *psVar18;
          local_108.field_2._8_8_ = puVar16[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar18;
          local_108._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_108._M_string_length = puVar16[1];
        *puVar16 = psVar18;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::operator+(&local_148,&local_108,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        pFVar17);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar13) {
          local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_170.field_2._8_8_ = puVar16[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_170._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_170._M_string_length = puVar16[1];
        *puVar16 = paVar13;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::operator+(&local_198,&local_170,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        oneof_descriptor);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_1d0._0_8_ = local_1d0 + 0x10;
        pcVar20 = (code *)(puVar16 + 2);
        if ((code *)*puVar16 == pcVar20) {
          local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
          local_1c0[0]._8_8_ = puVar16[3];
        }
        else {
          local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
          local_1d0._0_8_ = (code *)*puVar16;
        }
        local_1d0._8_8_ = puVar16[1];
        *puVar16 = pcVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        paVar13 = &local_b0.field_2;
      }
      else {
        std::operator+(&local_198,"Non-repeated field \"",&local_128);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_1d0._0_8_ = local_1d0 + 0x10;
        pcVar20 = (code *)(puVar16 + 2);
        if ((code *)*puVar16 == pcVar20) {
          local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
          local_1c0[0]._8_8_ = puVar16[3];
        }
        else {
          local_1c0[0]._0_8_ = *(undefined8 *)pcVar20;
          local_1d0._0_8_ = (code *)*puVar16;
        }
        local_1d0._8_8_ = puVar16[1];
        *puVar16 = pcVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        paVar13 = &local_198.field_2;
      }
LAB_002acc4c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar13->_M_allocated_capacity)[-2] != paVar13) {
        operator_delete((undefined1 *)(&paVar13->_M_allocated_capacity)[-2]);
      }
LAB_002ad051:
      bVar5 = false;
    }
    else {
LAB_002ac8c4:
      if (*(once_flag **)(paVar13->_M_local_buf + 0x30) != (once_flag *)0x0) {
        local_1d0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_198._M_dataplus._M_p = (pointer)paVar13;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(paVar13->_M_local_buf + 0x30),
                   (_func_void_FieldDescriptor_ptr **)local_1d0,(FieldDescriptor **)&local_198);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(uint *)(paVar13->_M_local_buf + 0x38) * 4) == 10) {
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,":","");
        bVar5 = TryConsume(this,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        iVar7 = 0;
        if (((bVar5) && (*(char *)(*(long *)(paVar13->_M_local_buf + 0x78) + 0x4f) == '\x01')) &&
           ((this->tokenizer_).current_.type == TYPE_STRING)) {
          local_1d0._0_8_ = local_1d0 + 0x10;
          local_1d0._8_8_ = (char *)0x0;
          local_1c0[0]._M_allocated_capacity =
               local_1c0[0]._M_allocated_capacity & 0xffffffffffffff00;
          bVar5 = ConsumeString(this,(string *)local_1d0);
          iVar7 = 1;
          if (bVar5) {
            pFVar1 = this->finder_;
            if (pFVar1 == (Finder *)0x0) {
              factory = (MessageFactory *)0x0;
            }
            else {
              iVar7 = (*pFVar1->_vptr_Finder[5])(pFVar1,paVar13);
              factory = (MessageFactory *)CONCAT44(extraout_var_04,iVar7);
            }
            this_00 = &Reflection::MutableMessage
                                 (local_150,local_178,(FieldDescriptor *)paVar13->_M_local_buf,
                                  factory)->super_MessageLite;
            iVar7 = 2;
            MessageLite::ParseFromString(this_00,(string *)local_1d0);
          }
          if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
            operator_delete((void *)local_1d0._0_8_);
          }
        }
        if (iVar7 == 0) goto LAB_002acd54;
        if (iVar7 != 2) goto LAB_002ad051;
      }
      else {
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,":","");
        bVar5 = Consume(this,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        if (!bVar5) goto LAB_002ad051;
LAB_002acd54:
        if (*(int *)(paVar13->_M_local_buf + 0x3c) == 3) {
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"[","");
          bVar5 = TryConsume(this,(string *)local_1d0);
          if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
            operator_delete((void *)local_1d0._0_8_);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5 == false) {
          CVar8 = FieldDescriptor::cpp_type((FieldDescriptor *)paVar13->_M_local_buf);
          if (CVar8 == CPPTYPE_MESSAGE) {
            bVar5 = ConsumeFieldMessage(this,local_178,local_150,
                                        (FieldDescriptor *)paVar13->_M_local_buf);
          }
          else {
            bVar5 = ConsumeFieldValue(this,local_178,local_150,
                                      (FieldDescriptor *)paVar13->_M_local_buf);
          }
          if (bVar5 == false) goto LAB_002ad051;
        }
        else {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"]","");
          bVar5 = TryConsume(this,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if (!bVar5) {
            do {
              if (*(once_flag **)(paVar13->_M_local_buf + 0x30) != (once_flag *)0x0) {
                local_198._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
                local_170._M_dataplus._M_p = (pointer)paVar13;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(paVar13->_M_local_buf + 0x30),
                           (_func_void_FieldDescriptor_ptr **)&local_198,
                           (FieldDescriptor **)&local_170);
              }
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                          (ulong)*(uint *)(paVar13->_M_local_buf + 0x38) * 4) == 10) {
                bVar5 = ConsumeFieldMessage(this,local_178,local_150,
                                            (FieldDescriptor *)paVar13->_M_local_buf);
              }
              else {
                bVar5 = ConsumeFieldValue(this,local_178,local_150,
                                          (FieldDescriptor *)paVar13->_M_local_buf);
              }
              if (bVar5 == false) goto LAB_002ad051;
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"]","");
              bVar5 = TryConsume(this,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if (bVar5) goto LAB_002acf67;
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,",","");
              bVar6 = Consume(this,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              bVar5 = false;
            } while (bVar6);
            goto LAB_002ad053;
          }
        }
      }
LAB_002acf67:
      paVar10 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,";","");
      bVar5 = TryConsume(this,&local_198);
      if (!bVar5) {
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,",","");
        TryConsume(this,&local_170);
        if ((!bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2)) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar10) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if (*(char *)(*(long *)(paVar13->_M_local_buf + 0x78) + 0x4e) == '\x01') {
        std::operator+(&local_148,"text format contains deprecated field \"",&local_128);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_148);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 == paVar21) {
          local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_198.field_2._8_8_ = plVar12[3];
          local_198._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_198._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_198._M_string_length = plVar12[1];
        *plVar12 = (long)paVar21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar10) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
      }
      bVar5 = true;
      if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
        ParseInfoTree::RecordLocation
                  (this->parse_info_tree_,(FieldDescriptor *)paVar13->_M_local_buf,
                   (ParseLocation)((local_b8 << 0x20) + local_c0));
      }
    }
    goto LAB_002ad053;
  }
  if (((this->allow_unknown_extension_ | this->allow_unknown_field_) & 1U) == 0 && !bVar5) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_1d0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x1fb);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_1d0,
                       "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                      );
    internal::LogFinisher::operator=((LogFinisher *)&local_198,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_1d0);
  }
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,":","");
  bVar5 = TryConsume(this,(string *)local_1d0);
  if (bVar5) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"{","");
    sVar3 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar3 == local_198._M_string_length) &&
       ((sVar3 == 0 ||
        (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_198._M_dataplus._M_p,
                      sVar3), iVar7 == 0)))) goto LAB_002ac7bf;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"<","");
    sVar3 = (this->tokenizer_).current_.text._M_string_length;
    bVar4 = true;
    if (sVar3 == local_170._M_string_length) {
      bVar6 = true;
      if (sVar3 != 0) {
        iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_170._M_dataplus._M_p,
                     sVar3);
        bVar6 = iVar7 != 0;
        goto LAB_002ac7c5;
      }
      goto LAB_002ac7c2;
    }
    bVar6 = true;
  }
  else {
LAB_002ac7bf:
    bVar6 = false;
LAB_002ac7c2:
    bVar4 = bVar6;
    bVar6 = false;
  }
LAB_002ac7c5:
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2)) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2)) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (bVar6) {
    bVar5 = SkipFieldValue(this);
  }
  else {
    bVar5 = SkipFieldMessage(this);
  }
LAB_002ad053:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }